

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createLoad
          (Builder *this,Id lValue,Decoration precision,MemoryAccessMask memoryAccess,Scope scope,
          uint alignment)

{
  uint memoryAccess_00;
  Id IVar1;
  Id typeId;
  StorageClass sc;
  MemoryAccessMask MVar2;
  Instruction *pIVar3;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  Instruction *local_30;
  Instruction *load;
  Scope local_20;
  uint alignment_local;
  Scope scope_local;
  MemoryAccessMask memoryAccess_local;
  Decoration precision_local;
  Id lValue_local;
  Builder *this_local;
  
  load._4_4_ = alignment;
  local_20 = scope;
  alignment_local = memoryAccess;
  scope_local = precision;
  memoryAccess_local = lValue;
  _precision_local = this;
  pIVar3 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  typeId = getDerefTypeId(this,memoryAccess_local);
  spv::Instruction::Instruction(pIVar3,IVar1,typeId,OpLoad);
  local_30 = pIVar3;
  spv::Instruction::addIdOperand(pIVar3,memoryAccess_local);
  memoryAccess_00 = alignment_local;
  sc = getStorageClass(this,memoryAccess_local);
  alignment_local = sanitizeMemoryAccessForStorageClass(this,memoryAccess_00,sc);
  if (alignment_local != MaskNone) {
    spv::Instruction::addImmediateOperand(local_30,alignment_local);
    MVar2 = spv::operator&(alignment_local,Aligned);
    if (MVar2 != MaskNone) {
      spv::Instruction::addImmediateOperand(local_30,load._4_4_);
    }
    MVar2 = spv::operator&(alignment_local,MakePointerVisible);
    pIVar3 = local_30;
    if (MVar2 != MaskNone) {
      IVar1 = makeUintConstant(this,local_20,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
    }
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             local_30);
  addInstruction(this,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  IVar1 = spv::Instruction::getResultId(local_30);
  setPrecision(this,IVar1,scope_local);
  IVar1 = spv::Instruction::getResultId(local_30);
  return IVar1;
}

Assistant:

Id Builder::createLoad(Id lValue, spv::Decoration precision, spv::MemoryAccessMask memoryAccess,
    spv::Scope scope, unsigned int alignment)
{
    Instruction* load = new Instruction(getUniqueId(), getDerefTypeId(lValue), OpLoad);
    load->addIdOperand(lValue);

    memoryAccess = sanitizeMemoryAccessForStorageClass(memoryAccess, getStorageClass(lValue));

    if (memoryAccess != MemoryAccessMaskNone) {
        load->addImmediateOperand(memoryAccess);
        if (memoryAccess & spv::MemoryAccessAlignedMask) {
            load->addImmediateOperand(alignment);
        }
        if (memoryAccess & spv::MemoryAccessMakePointerVisibleKHRMask) {
            load->addIdOperand(makeUintConstant(scope));
        }
    }

    addInstruction(std::unique_ptr<Instruction>(load));
    setPrecision(load->getResultId(), precision);

    return load->getResultId();
}